

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::updateFtran(HDual *this)

{
  reference pvVar1;
  HTimer *in_RDI;
  HFactor *unaff_retaddr;
  double in_stack_00000068;
  int in_stack_00000074;
  HVector *in_stack_00000078;
  HMatrix *in_stack_00000080;
  int in_stack_ffffffffffffffec;
  HTimer *vector;
  
  if (*(int *)((long)in_RDI->itemTicks + 0x7c) == 0) {
    vector = in_RDI;
    HTimer::recordStart(in_RDI,in_stack_ffffffffffffffec);
    HVector::clear((HVector *)this);
    in_RDI->field_0x350 = 1;
    HMatrix::collect_aj(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000068);
    HFactor::ftran(unaff_retaddr,(HVector *)vector,(double)in_RDI);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RDI->field_0x2f0,
                        (long)*(int *)&in_RDI[1].field_0x1d0);
    *(value_type *)&in_RDI[1].field_0x1f8 = *pvVar1;
    HTimer::recordFinish(in_RDI,in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

void HDual::updateFtran() {
	if (invertHint)
		return;
	model->timer.recordStart(HTICK_FTRAN);
	column.clear();
	column.packFlag = true;
	matrix->collect_aj(column, columnIn, 1);
	factor->ftran(column, columnDensity);
	alpha = column.array[rowOut];
	model->timer.recordFinish(HTICK_FTRAN);
}